

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_utilities.c
# Opt level: O0

wchar_t UnicodeUtilities_print_wide_character_to_utf8_buffer
                  (uchar *buffer,wchar_t *text,wchar_t pos)

{
  Utf8Bytes local_2e;
  long lStack_28;
  Utf8Bytes utf8_bytes;
  long code_point;
  wchar_t pos_local;
  wchar_t *text_local;
  uchar *buffer_local;
  
  UnicodeUtilities_is_utf16_surrogate(text[pos]);
  lStack_28 = (long)text[pos];
  write_utf8_bytes_for_code_point(&local_2e,lStack_28);
  print_code_point_to_utf8_buffer(buffer,&local_2e);
  return (wchar_t)local_2e.byte_count;
}

Assistant:

int UnicodeUtilities_print_wide_character_to_utf8_buffer(unsigned char* buffer, const wchar_t* text, int pos) {
    long code_point;
    if (!UnicodeUtilities_is_utf16_surrogate(text[pos]) || sizeof(wchar_t) > 2) {
        code_point = (long)text[pos];
    } else {
        code_point = get_code_point_from_utf16_surrogate(text, pos++);
    }
    Utf8Bytes utf8_bytes;
    write_utf8_bytes_for_code_point(&utf8_bytes, code_point);
    print_code_point_to_utf8_buffer(buffer, &utf8_bytes);
    return utf8_bytes.byte_count;
}